

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::AddRequiredTargetCFeature(cmMakefile *this,cmTarget *target,string *feature)

{
  pointer pcVar1;
  bool bVar2;
  char *__s;
  char **ppcVar3;
  ostream *poVar4;
  size_t sVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool needC11;
  bool needC99;
  bool needC90;
  ostringstream e;
  bool local_27b;
  bool local_27a;
  bool local_279;
  char **local_278;
  cmTarget *local_270;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_279 = false;
  local_27a = false;
  local_27b = false;
  CheckNeededCLanguage(this,feature,&local_279,&local_27a,&local_27b);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
  __s = cmTarget::GetProperty(target,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (__s == (char *)0x0) {
    local_278 = (char **)&DAT_005c89c8;
  }
  else {
    std::__cxx11::string::string((string *)local_1c8,__s,(allocator *)local_1a8);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005c89c8,(cmStrCmp *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (ppcVar3 == (char **)&DAT_005c89c8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The C_STANDARD property on target \"",0x23);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(target->Name)._M_dataplus._M_p,
                          (target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\" contained an invalid value: \"",0x1f);
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_208,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    std::__cxx11::string::string((string *)local_1e8,__s,(allocator *)local_1a8);
    local_278 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_005c89c8,(cmStrCmp *)local_1e8);
  }
  local_270 = target;
  if ((__s != (char *)0x0) && (local_1e8[0] != local_1d8)) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  bVar2 = local_279;
  bVar11 = local_27a;
  bVar12 = local_27b;
  bVar13 = __s == (char *)0x0;
  bVar8 = !bVar13 & local_27b;
  if (bVar8 == 1) {
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"11","");
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005c89c8,(cmStrCmp *)local_228);
    bVar10 = local_278 < ppcVar3;
  }
  else {
    bVar10 = false;
  }
  if ((bVar8 != 0) && (local_228[0] != local_218)) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  bVar8 = bVar13 & bVar2;
  bVar9 = bVar13 & bVar11;
  if (bVar10) {
    bVar7 = 1;
  }
  else {
    bVar7 = __s != (char *)0x0 & bVar11;
    if (bVar7 == 1) {
      local_268[0] = local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"99","");
      ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_005c89c8,(cmStrCmp *)local_268);
      bVar11 = local_278 < ppcVar3;
    }
    else {
      bVar11 = false;
    }
    if ((bVar7 != 0) && (local_268[0] != local_258)) {
      operator_delete(local_268[0],local_258[0] + 1);
    }
    bVar7 = bVar13 & bVar12;
    if (bVar11) {
      bVar9 = 1;
    }
    else {
      bVar6 = __s != (char *)0x0 & bVar2;
      if (bVar6 == 1) {
        local_248[0] = local_238;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"90","");
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_005c89c8,(cmStrCmp *)local_248);
        bVar12 = local_278 < ppcVar3;
      }
      else {
        bVar12 = false;
      }
      if ((bVar6 != 0) && (local_248[0] != local_238)) {
        operator_delete(local_248[0],local_238[0] + 1);
      }
      bVar8 = bVar8 | bVar12;
    }
  }
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  if (bVar7 == 0) {
    if (bVar9 == 0) {
      if (bVar8 == 0) {
        return true;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
      cmTarget::SetProperty(local_270,(string *)local_1a8,"90");
      if ((pointer)local_1a8._0_8_ == pcVar1) {
        return true;
      }
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      return true;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"99");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"11");
  }
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmMakefile::
AddRequiredTargetCFeature(cmTarget *target, const std::string& feature) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char *existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard)
    {
    if (std::find_if(cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS),
                  cmStrCmp(existingCStandard)) == cmArrayEnd(C_STANDARDS))
      {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  const char * const *existingCIt = existingCStandard
                                    ? std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp(existingCStandard))
                                    : cmArrayEnd(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("11")))
    {
    setC11 = true;
    }
  else if(needC99 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("99")))
    {
    setC99 = true;
    }
  else if(needC90 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("90")))
    {
    setC90 = true;
    }

  if (setC11)
    {
    target->SetProperty("C_STANDARD", "11");
    }
  else if (setC99)
    {
    target->SetProperty("C_STANDARD", "99");
    }
  else if (setC90)
    {
    target->SetProperty("C_STANDARD", "90");
    }
  return true;
}